

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O0

string * ApprovalTests::Grid::print_abi_cxx11_
                   (int width,int height,
                   function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
                   *printCell)

{
  basic_ostream<char,_std::char_traits<char>_> *in_RCX;
  int in_EDX;
  int in_ESI;
  string *in_RDI;
  int x;
  int y;
  stringstream s;
  string *this;
  int local_1a8;
  int local_1a4;
  stringstream local_1a0 [16];
  ostream local_190;
  int local_10;
  int local_c;
  
  this = in_RDI;
  local_10 = in_EDX;
  local_c = in_ESI;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  for (local_1a4 = 0; local_1a4 < local_10; local_1a4 = local_1a4 + 1) {
    for (local_1a8 = 0; local_1a8 < local_c; local_1a8 = local_1a8 + 1) {
      ::std::function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)>::
      operator()((function<void_(int,_int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
                 this,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_RCX);
    }
    ::std::operator<<(&local_190,'\n');
  }
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string Grid::print(int width,
                            int height,
                            std::function<void(int, int, std::ostream&)> printCell)
    {
        std::stringstream s;
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                printCell(x, y, s);
            }
            s << '\n';
        }
        return s.str();
    }